

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O2

string * __thiscall
t_json_generator::escape_json_string
          (string *__return_storage_ptr__,t_json_generator *this,string *input)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  char *pcVar4;
  size_type sVar5;
  ostringstream ss;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar2 = (input->_M_dataplus)._M_p;
  sVar3 = input->_M_string_length;
  sVar5 = 0;
  do {
    if (sVar3 == sVar5) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      return __return_storage_ptr__;
    }
    cVar1 = pcVar2[sVar5];
    switch(cVar1) {
    case '\b':
      pcVar4 = "\\b";
      break;
    case '\t':
      pcVar4 = "\\t";
      break;
    case '\n':
      pcVar4 = "\\n";
      break;
    case '\v':
switchD_00237649_caseD_b:
      std::operator<<((ostream *)local_1a8,cVar1);
      goto LAB_002376af;
    case '\f':
      pcVar4 = "\\f";
      break;
    case '\r':
      pcVar4 = "\\r";
      break;
    default:
      pcVar4 = "\\\"";
      if (cVar1 != '\"') {
        if (cVar1 == '/') {
          pcVar4 = "\\/";
        }
        else {
          if (cVar1 != '\\') goto switchD_00237649_caseD_b;
          pcVar4 = "\\\\";
        }
      }
    }
    std::operator<<((ostream *)local_1a8,pcVar4);
LAB_002376af:
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

string t_json_generator::escape_json_string(const string& input) {
  std::ostringstream ss;
  for (char iter : input) {
    switch (iter) {
    case '\\':
      ss << "\\\\";
      break;
    case '"':
      ss << "\\\"";
      break;
    case '/':
      ss << "\\/";
      break;
    case '\b':
      ss << "\\b";
      break;
    case '\f':
      ss << "\\f";
      break;
    case '\n':
      ss << "\\n";
      break;
    case '\r':
      ss << "\\r";
      break;
    case '\t':
      ss << "\\t";
      break;
    default:
      ss << iter;
      break;
    }
  }
  return ss.str();
}